

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_material.cpp
# Opt level: O3

uchar * __thiscall
FGLTexture::CreateTexBuffer
          (FGLTexture *this,int translation,int *w,int *h,FTexture *hirescheck,bool createexpanded,
          bool alphatrans)

{
  ushort uVar1;
  FTexture *this_00;
  byte bVar2;
  int iVar3;
  uchar *puVar4;
  BYTE *__s;
  uint x;
  int srcwidth;
  ulong __n;
  int srcheight;
  uint uVar5;
  FGLBitmap local_a8;
  undefined **local_70;
  ulong local_68;
  undefined **local_60;
  BYTE *local_58;
  int local_50;
  int local_4c;
  uint local_48;
  char local_44;
  undefined8 local_40;
  int local_38;
  int local_34;
  ulong uVar6;
  
  if (((hirescheck != (FTexture *)0x0 && !alphatrans) && gl_texture_usehires.Value) &&
     (puVar4 = LoadHiresTexture(this,hirescheck,w,h), puVar4 != (uchar *)0x0)) {
    return puVar4;
  }
  bVar2 = this->bExpandFlag & createexpanded;
  x = (uint)bVar2;
  this_00 = this->tex;
  srcwidth = (uint)this_00->Width + (uint)bVar2 * 2;
  *w = srcwidth;
  uVar1 = this_00->Height;
  srcheight = (uint)uVar1 + (uint)bVar2 * 2;
  *h = srcheight;
  uVar5 = srcwidth * 4;
  uVar6 = (ulong)uVar5;
  __n = (ulong)(((uint)uVar1 + (uint)bVar2 * 2 + 1) * uVar5);
  puVar4 = (uchar *)operator_new__(__n);
  memset(puVar4,0,__n);
  local_a8.super_FBitmap.FreeBuffer = false;
  local_a8.super_FBitmap.ClipRect.x = 0;
  local_a8.super_FBitmap.ClipRect.y = 0;
  local_a8.super_FBitmap._vptr_FBitmap = (_func_int **)&PTR__FBitmap_00869e70;
  local_a8.translation = 0;
  local_a8.super_FBitmap.data = puVar4;
  local_a8.super_FBitmap.Width = srcwidth;
  local_a8.super_FBitmap.Height = srcheight;
  local_a8.super_FBitmap.Pitch = uVar5;
  local_a8.super_FBitmap.ClipRect.width = srcwidth;
  local_a8.super_FBitmap.ClipRect.height = srcheight;
  local_68 = uVar6;
  if (translation == -0x539) {
    if ((this_00->field_0x32 & 1) != 0) {
LAB_0045d57f:
      local_a8.alphatrans = alphatrans;
      local_70 = &PTR__FBitmap_0088c420;
      local_60 = &PTR__FBitmap_0088c420;
      local_50 = srcwidth;
      local_4c = srcheight;
      local_48 = uVar5;
      __s = (BYTE *)operator_new__((ulong)(srcheight * uVar5));
      local_58 = __s;
      memset(__s,0,(ulong)(srcheight * uVar5));
      local_44 = '\x01';
      local_40 = 0;
      local_38 = srcwidth;
      local_34 = srcheight;
      memset(__s,0,(ulong)(uint)(srcheight * srcwidth * 4));
      iVar3 = (*this_00->_vptr_FTexture[4])(this_00,&local_60,(ulong)x,(ulong)x,0,0);
      FGLBitmap::CopyPixelDataRGB
                (&local_a8,0,0,local_58,srcwidth,srcheight,4,(int)local_68,0,6,(FCopyInfo *)0x0,0,0,
                 0);
      FTexture::CheckTrans(this->tex,puVar4,srcheight * srcwidth,iVar3);
      this->bIsTransparent = (char)((this->tex->gl_info).field_0x4c << 6) >> 6;
      local_60 = local_70;
      if ((local_58 != (BYTE *)0x0) && (local_44 == '\x01')) {
        operator_delete__(local_58);
      }
      goto LAB_0045d714;
    }
  }
  else {
    local_a8.alphatrans = alphatrans;
    local_a8.translation = translation;
    if ((this_00->field_0x32 & 1) != 0) goto LAB_0045d57f;
    if (0 < translation) {
      FTexture::CopyTrueColorPixels
                (this_00,&local_a8.super_FBitmap,x,(uint)bVar2,0,(FCopyInfo *)0x0);
      this->bIsTransparent = '\0';
      goto LAB_0045d714;
    }
  }
  local_a8.alphatrans = alphatrans;
  iVar3 = (*this_00->_vptr_FTexture[4])(this_00,&local_a8,(ulong)x,(ulong)x,0,0);
  FTexture::CheckTrans(this->tex,puVar4,srcheight * srcwidth,iVar3);
  this->bIsTransparent = (char)((this->tex->gl_info).field_0x4c << 6) >> 6;
LAB_0045d714:
  if (createexpanded) {
    puVar4 = gl_CreateUpsampledTextureBuffer
                       (this->tex,puVar4,srcwidth,srcheight,w,h,this->bIsTransparent != '\0');
  }
  local_a8.super_FBitmap._vptr_FBitmap = (_func_int **)&PTR__FBitmap_0088c420;
  if ((local_a8.super_FBitmap.data != (uchar *)0x0) && (local_a8.super_FBitmap.FreeBuffer == true))
  {
    operator_delete__(local_a8.super_FBitmap.data);
  }
  return puVar4;
}

Assistant:

unsigned char * FGLTexture::CreateTexBuffer(int translation, int & w, int & h, FTexture *hirescheck, bool createexpanded, bool alphatrans)
{
	unsigned char * buffer;
	int W, H;


	// Textures that are already scaled in the texture lump will not get replaced
	// by hires textures
	if (gl_texture_usehires && hirescheck != NULL && !alphatrans)
	{
		buffer = LoadHiresTexture (hirescheck, &w, &h);
		if (buffer)
		{
			return buffer;
		}
	}

	int exx = bExpandFlag && createexpanded;

	W = w = tex->GetWidth() + 2 * exx;
	H = h = tex->GetHeight() + 2 * exx;


	buffer=new unsigned char[W*(H+1)*4];
	memset(buffer, 0, W * (H+1) * 4);

	FGLBitmap bmp(buffer, W*4, W, H);
	bmp.SetTranslationInfo(translation, alphatrans);

	if (tex->bComplex)
	{
		FBitmap imgCreate;

		// The texture contains special processing so it must be composited using the
		// base bitmap class and then be converted as a whole.
		if (imgCreate.Create(W, H))
		{
			memset(imgCreate.GetPixels(), 0, W * H * 4);
			int trans = tex->CopyTrueColorPixels(&imgCreate, exx, exx);
			bmp.CopyPixelDataRGB(0, 0, imgCreate.GetPixels(), W, H, 4, W * 4, 0, CF_BGRA);
			tex->CheckTrans(buffer, W*H, trans);
			bIsTransparent = tex->gl_info.mIsTransparent;
		}
	}
	else if (translation<=0)
	{
		int trans = tex->CopyTrueColorPixels(&bmp, exx, exx);
		tex->CheckTrans(buffer, W*H, trans);
		bIsTransparent = tex->gl_info.mIsTransparent;
	}
	else
	{
		// When using translations everything must be mapped to the base palette.
		// Since FTexture's method is doing exactly that by calling GetPixels let's use that here
		// to do all the dirty work for us. ;)
		tex->FTexture::CopyTrueColorPixels(&bmp, exx, exx);
		bIsTransparent = 0;
	}

	// if we just want the texture for some checks there's no need for upsampling.
	if (!createexpanded) return buffer;

	// [BB] The hqnx upsampling (not the scaleN one) destroys partial transparency, don't upsamle textures using it.
	// [BB] Potentially upsample the buffer.
	return gl_CreateUpsampledTextureBuffer ( tex, buffer, W, H, w, h, !!bIsTransparent);
}